

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon_x11.cpp
# Opt level: O0

void __thiscall QSystemTrayIconPrivate::updateMenu_sys(QSystemTrayIconPrivate *this)

{
  long *plVar1;
  bool bVar2;
  QPlatformMenu *pQVar3;
  long in_RDI;
  QMenu *unaff_retaddr;
  QSystemTrayIconPrivate *in_stack_00000008;
  
  if ((*(long *)(in_RDI + 0xb0) != 0) &&
     (bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QMenu> *)0xa9af0f), bVar2)) {
    ::QPointer::operator_cast_to_QMenu_((QPointer<QMenu> *)0xa9af23);
    addPlatformMenu(in_stack_00000008,unaff_retaddr);
    plVar1 = *(long **)(in_RDI + 0xb0);
    QPointer<QMenu>::operator->((QPointer<QMenu> *)0xa9af49);
    pQVar3 = QMenu::platformMenu((QMenu *)0xa9af51);
    (**(code **)(*plVar1 + 0x80))(plVar1,pQVar3);
  }
  return;
}

Assistant:

void QSystemTrayIconPrivate::updateMenu_sys()
{
#if QT_CONFIG(menu)
    if (qpa_sys && menu) {
        addPlatformMenu(menu);
        qpa_sys->updateMenu(menu->platformMenu());
    }
#endif
}